

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O2

void __thiscall
Diligent::RefCntAutoPtr<Diligent::IShader>::DoublePtrHelper<Diligent::IShader>::~DoublePtrHelper
          (DoublePtrHelper<Diligent::IShader> *this)

{
  RefCntAutoPtr<Diligent::IShader> *this_00;
  IShader *pIVar1;
  
  this_00 = this->m_pAutoPtr;
  if ((this_00 != (RefCntAutoPtr<Diligent::IShader> *)0x0) &&
     (pIVar1 = this->NewRawPtr, this_00->m_pObject != pIVar1)) {
    RefCntAutoPtr<Diligent::IShader>::Release(this_00);
    this_00->m_pObject = pIVar1;
  }
  return;
}

Assistant:

~DoublePtrHelper()
        {
            if (m_pAutoPtr && *m_pAutoPtr != static_cast<T*>(NewRawPtr))
            {
                m_pAutoPtr->Attach(static_cast<T*>(NewRawPtr));
            }
        }